

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetFunctionTableName(ExpressionContext *ctx,FunctionData *function)

{
  SynIdentifier *pSVar1;
  char *__haystack;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  size_t sVar5;
  ulong size;
  InplaceStr IVar6;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    __assert_fail("function->scope->ownerType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x1b9,"InplaceStr GetFunctionTableName(ExpressionContext &, FunctionData *)");
  }
  pSVar1 = function->name;
  __haystack = (pSVar1->name).begin;
  pcVar4 = strstr(__haystack,"::");
  if (pcVar4 != (char *)0x0) {
    size = (ulong)((*(int *)&(pSVar1->name).end - (int)__haystack) + 0x21);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,size);
    IVar6.begin = (char *)CONCAT44(extraout_var,iVar2);
    uVar3 = NULLC::GetStringHash
                      ((function->type->super_TypeBase).name.begin,
                       (function->type->super_TypeBase).name.end);
    NULLC::SafeSprintf(IVar6.begin,size,"$vtbl%010u%s",(ulong)uVar3,pcVar4 + 2);
    sVar5 = strlen(IVar6.begin);
    IVar6.end = IVar6.begin + sVar5;
    return IVar6;
  }
  __assert_fail("pos",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x1bd,"InplaceStr GetFunctionTableName(ExpressionContext &, FunctionData *)");
}

Assistant:

InplaceStr GetFunctionTableName(ExpressionContext &ctx, FunctionData *function)
{
	assert(function->scope->ownerType);

	const char *pos = strstr(function->name->name.begin, "::");

	assert(pos);

	unsigned nameLength = function->name->name.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);
	NULLC::SafeSprintf(name, nameLength, "$vtbl%010u%s", function->type->name.hash(), pos + 2);

	return InplaceStr(name);
}